

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

char16_t * PAL_wcschr(char16_t *string,char16_t c)

{
  char16_t cVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  cVar1 = *string;
  while( true ) {
    if (cVar1 == L'\0') {
      if (c != L'\0') {
        string = (char16_t *)0x0;
      }
      return string;
    }
    if (cVar1 == c) break;
    cVar1 = string[1];
    string = string + 1;
  }
  return string;
}

Assistant:

char16_t _WConst_return *
__cdecl
PAL_wcschr(
        const char16_t * string,
        char16_t c)
{
    PERF_ENTRY(wcschr);
    ENTRY("wcschr (string=%p (%S), c=%C)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING, c);

    while (*string)
    {
        if (*string == c)
        {
            LOGEXIT("wcschr returning char16_t %p (%S)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING);
            PERF_EXIT(wcschr);
            return (char16_t *) string;
        }
        string++;
    }

    // Check if the comparand was \000
    if (*string == c)
        return (char16_t *) string;

    LOGEXIT("wcschr returning char16_t NULL\n");
    PERF_EXIT(wcschr);
    return NULL;
}